

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O0

void __thiscall Ptex::v2_2::PtexReader::MetaData::~MetaData(MetaData *this)

{
  MetaData *in_RDI;
  
  ~MetaData(in_RDI);
  operator_delete(in_RDI,0x58);
  return;
}

Assistant:

~MetaData() {}